

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::parse_date(Datetime *this,Pig *pig)

{
  bool bVar1;
  uint uVar2;
  size_type previous;
  size_type checkpointYear;
  int day;
  int weekday;
  int week;
  int julian;
  int month;
  int year;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  checkpoint = (size_type)pig;
  pig_local = (Pig *)this;
  _month = Pig::cursor(pig);
  julian = 0;
  week = 0;
  weekday = 0;
  day = 0;
  checkpointYear._4_4_ = 0;
  checkpointYear._0_4_ = 0;
  bVar1 = parse_year(this,(Pig *)checkpoint,&julian);
  if (bVar1) {
    previous = Pig::cursor((Pig *)checkpoint);
    bVar1 = Pig::skip((Pig *)checkpoint,0x57);
    if ((bVar1) && (bVar1 = parse_week(this,(Pig *)checkpoint,&day), bVar1)) {
      bVar1 = parse_weekday(this,(Pig *)checkpoint,(int *)((long)&checkpointYear + 4));
      if (!bVar1) {
        checkpointYear._4_4_ = weekstart;
      }
      uVar2 = Pig::peek((Pig *)checkpoint);
      bVar1 = unicodeLatinDigit(uVar2);
      if (!bVar1) {
        this->_year = julian;
        this->_week = day;
        this->_weekday = checkpointYear._4_4_;
        return true;
      }
    }
    Pig::restoreTo((Pig *)checkpoint,previous);
    bVar1 = parse_julian(this,(Pig *)checkpoint,&weekday);
    if (bVar1) {
      uVar2 = Pig::peek((Pig *)checkpoint);
      bVar1 = unicodeLatinDigit(uVar2);
      if (!bVar1) {
        this->_year = julian;
        this->_julian = weekday;
        return true;
      }
    }
    Pig::restoreTo((Pig *)checkpoint,previous);
    bVar1 = parse_month(this,(Pig *)checkpoint,&week);
    if (bVar1) {
      bVar1 = parse_day(this,(Pig *)checkpoint,(int *)&checkpointYear);
      if (bVar1) {
        uVar2 = Pig::peek((Pig *)checkpoint);
        bVar1 = unicodeLatinDigit(uVar2);
        if (!bVar1) {
          this->_year = julian;
          this->_month = week;
          this->_day = (int)checkpointYear;
          return true;
        }
      }
      else {
        uVar2 = Pig::peek((Pig *)checkpoint);
        bVar1 = unicodeLatinDigit(uVar2);
        if (!bVar1) {
          this->_year = julian;
          this->_month = week;
          this->_day = 1;
          return true;
        }
      }
    }
  }
  Pig::restoreTo((Pig *)checkpoint,_month);
  return false;
}

Assistant:

bool Datetime::parse_date (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int year {};
  int month {};
  int julian {};
  int week {};
  int weekday {};
  int day {};
  if (parse_year (pig, year))
  {
    auto checkpointYear = pig.cursor ();

    if (pig.skip ('W') &&
        parse_week (pig, week))
    {
      if (! (parse_weekday (pig, weekday)))
        weekday = Datetime::weekstart;

      if (! unicodeLatinDigit (pig.peek ()))
      {
        _year = year;
        _week = week;
        _weekday = weekday;
        return true;
      }
    }

    pig.restoreTo (checkpointYear);

    if (parse_julian (pig, julian) &&
        ! unicodeLatinDigit (pig.peek ()))
    {
      _year = year;
      _julian = julian;
      return true;
    }

    pig.restoreTo (checkpointYear);

    if (parse_month (pig, month))
    {
      if (parse_day (pig, day))
      {
        if (! unicodeLatinDigit (pig.peek ()))
        {
          _year = year;
          _month = month;
          _day = day;
          return true;
        }
      }
      else
      {
        if (! unicodeLatinDigit (pig.peek ()))
        {
          _year = year;
          _month = month;
          _day = 1;
          return true;
        }
      }
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}